

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O0

float __thiscall
Opcode::AABBTreeOfVerticesBuilder::GetSplittingValue
          (AABBTreeOfVerticesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box,
          udword axis)

{
  uint local_44;
  float local_40;
  udword i;
  float SplitValue;
  udword axis_local;
  AABB *global_box_local;
  udword nb_prims_local;
  udword *primitives_local;
  AABBTreeOfVerticesBuilder *this_local;
  
  if (((this->super_AABBTreeBuilder).mSettings.mRules & 0x20) == 0) {
    this_local._4_4_ =
         AABBTreeBuilder::GetSplittingValue
                   (&this->super_AABBTreeBuilder,primitives,nb_prims,global_box,axis);
  }
  else {
    local_40 = 0.0;
    for (local_44 = 0; local_44 < nb_prims; local_44 = local_44 + 1) {
      local_40 = (&this->mVertexArray[primitives[local_44]].x)[axis] + local_40;
    }
    this_local._4_4_ = local_40 / (float)nb_prims;
  }
  return this_local._4_4_;
}

Assistant:

float AABBTreeOfVerticesBuilder::GetSplittingValue(const udword* primitives, udword nb_prims, const AABB& global_box, udword axis)	const
{
	if(mSettings.mRules&SPLIT_GEOM_CENTER)
	{
		// Loop through vertices
		float SplitValue = 0.0f;
		for(udword i=0;i<nb_prims;i++)
		{
			// Update split value
			SplitValue += mVertexArray[primitives[i]][axis];
		}
		return SplitValue / float(nb_prims);
	}
	else return AABBTreeBuilder::GetSplittingValue(primitives, nb_prims, global_box, axis);
}